

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalKdevelopGenerator::Generate(cmGlobalKdevelopGenerator *this)

{
  bool bVar1;
  TargetType TVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *pmVar3;
  pointer ppVar4;
  const_reference ppcVar5;
  char *pcVar6;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs_00;
  reference ppcVar7;
  cmMakefile *this_00;
  pointer ppVar8;
  ulong uVar9;
  allocator local_179;
  string local_178;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_158;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_150;
  iterator ti;
  cmTargets *targets;
  cmMakefile *makefile;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_130;
  const_iterator lg;
  string executable;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs;
  string fileToOpen;
  undefined1 local_d0 [8];
  string cmakeFilePattern;
  undefined1 local_a8 [8];
  string projectName;
  undefined1 local_80 [8];
  string projectDir;
  allocator local_49;
  undefined1 local_48 [8];
  string outputDir;
  cmMakefile *mf;
  _Self local_18;
  const_iterator it;
  cmGlobalKdevelopGenerator *this_local;
  
  it._M_node = (_Base_ptr)this;
  pmVar3 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                     ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
       ::begin(pmVar3);
  do {
    pmVar3 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                       ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    mf = (cmMakefile *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
         ::end(pmVar3);
    bVar1 = std::operator!=(&local_18,(_Self *)&mf);
    if (!bVar1) {
      return;
    }
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
             ::operator->(&local_18);
    ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&ppVar4->second,0);
    outputDir.field_2._8_8_ = cmLocalGenerator::GetMakefile(*ppcVar5);
    pcVar6 = cmMakefile::GetCurrentBinaryDirectory((cmMakefile *)outputDir.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_48,pcVar6,&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    pcVar6 = cmMakefile::GetHomeDirectory((cmMakefile *)outputDir.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_80,pcVar6,(allocator *)(projectName.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(projectName.field_2._M_local_buf + 0xf));
    pcVar6 = cmMakefile::GetProjectName((cmMakefile *)outputDir.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_a8,pcVar6,(allocator *)(cmakeFilePattern.field_2._M_local_buf + 0xf))
    ;
    std::allocator<char>::~allocator
              ((allocator<char> *)(cmakeFilePattern.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_d0,"CMakeLists.txt;*.cmake;",
               (allocator *)(fileToOpen.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(fileToOpen.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)&lgs);
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
             ::operator->(&local_18);
    lgs_00 = &ppVar4->second;
    bVar1 = CreateFilelistFile(this,lgs_00,(string *)local_48,(string *)local_80,(string *)local_a8,
                               (string *)local_d0,(string *)&lgs);
    if (bVar1) {
      std::__cxx11::string::string((string *)&lg);
      local_130._M_current =
           (cmLocalGenerator **)
           std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(lgs_00);
      while( true ) {
        makefile = (cmMakefile *)
                   std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(lgs_00)
        ;
        bVar1 = __gnu_cxx::operator!=
                          (&local_130,
                           (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                            *)&makefile);
        if (!bVar1) break;
        ppcVar7 = __gnu_cxx::
                  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                  ::operator*(&local_130);
        this_00 = cmLocalGenerator::GetMakefile(*ppcVar7);
        ti.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
        ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                   )cmMakefile::GetTargets_abi_cxx11_(this_00);
        local_150._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
             ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                      *)ti.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                        ._M_cur);
        while( true ) {
          local_158._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
               ::end(ti.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                     ._M_cur);
          bVar1 = std::__detail::operator!=(&local_150,&local_158);
          if (!bVar1) break;
          ppVar8 = std::__detail::
                   _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                   ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                                 *)&local_150);
          TVar2 = cmTarget::GetType(&ppVar8->second);
          if (TVar2 == EXECUTABLE) {
            ppVar8 = std::__detail::
                     _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                     ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                                   *)&local_150);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_178,"",&local_179);
            pcVar6 = cmTarget::GetLocation(&ppVar8->second,&local_178);
            std::__cxx11::string::operator=((string *)&lg,pcVar6);
            std::__cxx11::string::~string((string *)&local_178);
            std::allocator<char>::~allocator((allocator<char> *)&local_179);
            break;
          }
          std::__detail::
          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
          ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                        *)&local_150,0);
        }
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) break;
        __gnu_cxx::
        __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
        ::operator++(&local_130,0);
      }
      CreateProjectFile(this,(string *)local_48,(string *)local_80,(string *)local_a8,(string *)&lg,
                        (string *)local_d0,(string *)&lgs);
      std::__cxx11::string::~string((string *)&lg);
      bVar1 = false;
    }
    else {
      cmSystemTools::Error("Can not create filelist file",(char *)0x0,(char *)0x0,(char *)0x0);
      bVar1 = true;
    }
    std::__cxx11::string::~string((string *)&lgs);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)local_48);
    if (bVar1) {
      return;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
    ::operator++(&local_18);
  } while( true );
}

Assistant:

void cmGlobalKdevelopGenerator::Generate()
{
  // for each sub project in the project create
  // a kdevelop project
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
      it!= this->GlobalGenerator->GetProjectMap().end();
      ++it)
    {
    cmMakefile* mf = it->second[0]->GetMakefile();
    std::string outputDir=mf->GetCurrentBinaryDirectory();
    std::string projectDir=mf->GetHomeDirectory();
    std::string projectName=mf->GetProjectName();
    std::string cmakeFilePattern("CMakeLists.txt;*.cmake;");
    std::string fileToOpen;
    const std::vector<cmLocalGenerator*>& lgs= it->second;
    // create the project.kdevelop.filelist file
    if(!this->CreateFilelistFile(lgs, outputDir, projectDir,
                                 projectName, cmakeFilePattern, fileToOpen))
      {
      cmSystemTools::Error("Can not create filelist file");
      return;
      }
    //try to find the name of an executable so we have something to
    //run from kdevelop for now just pick the first executable found
    std::string executable;
    for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
         lg!=lgs.end(); lg++)
      {
      cmMakefile* makefile=(*lg)->GetMakefile();
      cmTargets& targets=makefile->GetTargets();
      for (cmTargets::iterator ti = targets.begin();
           ti != targets.end(); ti++)
        {
        if (ti->second.GetType()==cmTarget::EXECUTABLE)
          {
          executable = ti->second.GetLocation("");
          break;
          }
        }
      if (!executable.empty())
        {
        break;
        }
      }

    // now create a project file
    this->CreateProjectFile(outputDir, projectDir, projectName,
                            executable, cmakeFilePattern, fileToOpen);
    }
}